

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O2

void ma_mutex_unlock(ma_mutex *pMutex)

{
  if (pMutex == (ma_mutex *)0x0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/stoneface86[P]trackerboy/vendored/miniaudio/miniaudio.c"
                  ,0x12d2,"void ma_mutex_unlock(ma_mutex *)");
  }
  pthread_mutex_unlock((pthread_mutex_t *)pMutex);
  return;
}

Assistant:

MA_API void ma_mutex_unlock(ma_mutex* pMutex)
{
    if (pMutex == NULL) {
        MA_ASSERT(MA_FALSE);    /* Fire an assert so the caller is aware of this bug. */
        return;
}

#ifdef MA_WIN32
    ma_mutex_unlock__win32(pMutex);
#endif
#ifdef MA_POSIX
    ma_mutex_unlock__posix(pMutex);
#endif
}